

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlEncode::encodeTo(XmlEncode *this,ostream *os)

{
  byte bVar1;
  pointer pcVar2;
  undefined8 in_RAX;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  if ((this->m_str)._M_string_length != 0) {
    uVar5 = 0;
    uStack_38 = in_RAX;
    do {
      pcVar2 = (this->m_str)._M_dataplus._M_p;
      bVar1 = pcVar2[uVar5];
      if (bVar1 < 0x3c) {
        if (bVar1 == 0x22) {
          if (this->m_forWhat == ForAttributes) {
            lVar3 = 6;
            pcVar4 = "&quot;";
          }
          else {
            uStack_38._0_7_ = CONCAT16(0x22,(undefined6)uStack_38);
            lVar3 = 1;
            pcVar4 = (char *)((long)&uStack_38 + 6);
          }
          goto LAB_0015fb93;
        }
        if (bVar1 == 0x26) {
          lVar3 = 5;
          pcVar4 = "&amp;";
          goto LAB_0015fb93;
        }
LAB_0015fabc:
        if (('\b' < (char)bVar1) && (bVar1 != 0x7f && 0x11 < (byte)(bVar1 - 0xe))) {
          uStack_38 = CONCAT17(bVar1,(undefined7)uStack_38);
          lVar3 = 1;
          pcVar4 = (char *)((long)&uStack_38 + 7);
          goto LAB_0015fb93;
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"&#x",3);
        *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x4000;
        *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffffb5 | 8;
        std::ostream::operator<<(os,(int)(char)bVar1);
      }
      else {
        if (bVar1 == 0x3e) {
          if (((uVar5 < 3) || (pcVar2[uVar5 - 1] != ']')) || (pcVar2[uVar5 - 2] != ']')) {
            uStack_38._0_6_ = CONCAT15(0x3e,(undefined5)uStack_38);
            lVar3 = 1;
            pcVar4 = (char *)((long)&uStack_38 + 5);
          }
          else {
            lVar3 = 4;
            pcVar4 = "&gt;";
          }
        }
        else {
          if (bVar1 != 0x3c) goto LAB_0015fabc;
          lVar3 = 4;
          pcVar4 = "&lt;";
        }
LAB_0015fb93:
        std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (this->m_str)._M_string_length);
  }
  return;
}

Assistant:

void encodeTo( std::ostream& os ) const {

            // Apostrophe escaping not necessary if we always use " to write attributes
            // (see: http://www.w3.org/TR/xml/#syntax)

            for( std::size_t i = 0; i < m_str.size(); ++ i ) {
                char c = m_str[i];
                switch( c ) {
                    case '<':   os << "&lt;"; break;
                    case '&':   os << "&amp;"; break;

                    case '>':
                        // See: http://www.w3.org/TR/xml/#syntax
                        if( i > 2 && m_str[i-1] == ']' && m_str[i-2] == ']' )
                            os << "&gt;";
                        else
                            os << c;
                        break;

                    case '\"':
                        if( m_forWhat == ForAttributes )
                            os << "&quot;";
                        else
                            os << c;
                        break;

                    default:
                        // Escape control chars - based on contribution by @espenalb in PR #465
                        if ( ( c < '\x09' ) || ( c > '\x0D' && c < '\x20') || c=='\x7F' )
                            os << "&#x" << std::uppercase << std::hex << static_cast<int>( c );
                        else
                            os << c;
                }
            }
        }